

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

void __thiscall
testing::Expectation::Expectation
          (Expectation *this,linked_ptr<testing::internal::ExpectationBase> *an_expectation_base)

{
  ExpectationBase *pEVar1;
  linked_ptr_internal *this_00;
  
  pEVar1 = an_expectation_base->value_;
  (this->expectation_base_).value_ = pEVar1;
  this_00 = &(this->expectation_base_).link_;
  if (pEVar1 != (ExpectationBase *)0x0) {
    internal::linked_ptr_internal::join(this_00,&an_expectation_base->link_);
    return;
  }
  this_00->next_ = this_00;
  return;
}

Assistant:

T* get() const { return value_; }